

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_multipivot.cpp
# Opt level: O0

void multikey_multipivot<unsigned_char,16u>(uchar **strings,size_t n,size_t depth)

{
  value_type vVar1;
  byte bVar2;
  value_type vVar3;
  value_type vVar4;
  uchar *puVar5;
  size_t sVar6;
  size_t n_00;
  size_t sVar7;
  uchar uVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  size_type sVar14;
  reference pvVar15;
  iterator __first;
  iterator __last;
  size_type sVar16;
  iterator __first_00;
  reference pvVar17;
  reference pvVar18;
  reference pvVar19;
  void *__src;
  double dVar20;
  undefined1 auVar21 [16];
  pair<std::_Rb_tree_const_iterator<unsigned_char>,_bool> pVar22;
  uint local_264;
  size_t sStack_260;
  uint i_6;
  size_t bsum;
  size_t b;
  size_t i_5;
  uint i_4;
  uchar **sorted_1;
  ulong uStack_230;
  uint8_t bucket;
  size_t i;
  bool sorted;
  value_type vStack_220;
  uint8_t prev;
  undefined1 local_218 [8];
  array<unsigned_long,_33UL> bucketsize;
  uint8_t *oracle;
  uint i_3;
  uint step;
  array<unsigned_char,_16UL> pivots;
  undefined1 local_d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_array;
  value_type_conflict local_ad [8];
  uchar i_2;
  uint local_9c;
  undefined1 local_97 [3];
  uint j;
  ulong uStack_90;
  array<unsigned_char,_7UL> tmp;
  size_t pos;
  double r;
  undefined1 local_78 [4];
  uint i_1;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> sample;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  undefined8 local_28;
  size_t local_20;
  uchar **local_18;
  unsigned_long local_10;
  
  sample._M_t._M_impl.super__Rb_tree_header._M_node_count = depth;
  if (n < 15000) {
    mkqsort(strings,(int)n,(int)depth);
  }
  else {
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::set
              ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
               local_78);
    for (r._4_4_ = 0; r._4_4_ < 0x10; r._4_4_ = r._4_4_ + 1) {
      dVar20 = drand48();
      lVar12 = n - 7;
      auVar21._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar21._0_8_ = lVar12;
      auVar21._12_4_ = 0x45300000;
      dVar20 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) * dVar20;
      uStack_90 = (ulong)dVar20;
      uStack_90 = uStack_90 | (long)(dVar20 - 9.223372036854776e+18) & (long)uStack_90 >> 0x3f;
      if (n <= uStack_90 + 6) {
        __assert_fail("pos+6 < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                      ,0x180,
                      "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned char, Pivots = 16U]"
                     );
      }
      for (local_9c = 0; uVar13 = (ulong)local_9c,
          sVar14 = std::array<unsigned_char,_7UL>::size((array<unsigned_char,_7UL> *)local_97),
          uVar13 < sVar14; local_9c = local_9c + 1) {
        uVar8 = get_char<unsigned_char>
                          (strings[uStack_90 + local_9c],
                           sample._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pvVar15 = std::array<unsigned_char,_7UL>::operator[]
                            ((array<unsigned_char,_7UL> *)local_97,(ulong)local_9c);
        *pvVar15 = uVar8;
      }
      __first = std::array<unsigned_char,_7UL>::begin((array<unsigned_char,_7UL> *)local_97);
      __last = std::array<unsigned_char,_7UL>::end((array<unsigned_char,_7UL> *)local_97);
      std::set<unsigned_char,std::less<unsigned_char>,std::allocator<unsigned_char>>::
      insert<unsigned_char*>
                ((set<unsigned_char,std::less<unsigned_char>,std::allocator<unsigned_char>> *)
                 local_78,__first,__last);
    }
    local_ad[0] = '\x01';
    while (sVar16 = std::
                    set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
                    size((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                          *)local_78), sVar16 < 0x10) {
      bVar9 = is_end<unsigned_char>(local_ad[0]);
      if (bVar9) {
        local_ad[0] = local_ad[0] + '\x01';
      }
      pVar22 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
               insert((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                       *)local_78,local_ad);
      sample_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pVar22.first._M_node;
      local_ad[0] = local_ad[0] + '\x01';
    }
    __first_00 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
                 begin((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                        *)local_78);
    register0x00000000 =
         std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::end
                   ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
                    local_78);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)(pivots._M_elems + 8));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::_Rb_tree_const_iterator<unsigned_char>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,
               (_Rb_tree_const_iterator<unsigned_char>)__first_00._M_node,
               (_Rb_tree_const_iterator<unsigned_char>)stack0xffffffffffffff18,
               (allocator<unsigned_char> *)(pivots._M_elems + 8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)(pivots._M_elems + 8));
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::clear
              ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
               local_78);
    sVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    iVar10 = (int)(sVar14 >> 4);
    if (iVar10 == 0) {
      __assert_fail("step > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                    ,0x191,
                    "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned char, Pivots = 16U]"
                   );
    }
    for (oracle._4_4_ = 0; oracle._4_4_ < 0x10; oracle._4_4_ = oracle._4_4_ + 1) {
      pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,
                           (ulong)(iVar10 * oracle._4_4_));
      vVar1 = *pvVar17;
      pvVar18 = std::array<unsigned_char,_16UL>::operator[]
                          ((array<unsigned_char,_16UL> *)((long)&i_3 + 3),(ulong)oracle._4_4_);
      *pvVar18 = vVar1;
    }
    local_28 = 0x10;
    local_20 = n;
    iVar10 = posix_memalign(&strings_local,0x10,n);
    if (iVar10 == 0) {
      local_18 = strings_local;
    }
    else {
      local_18 = (uchar **)0x0;
    }
    bucketsize._M_elems[0x20] = (unsigned_long)local_18;
    fill_oracle<16u,unsigned_char>
              (strings,n,(uint8_t *)local_18,(array<unsigned_char,_16UL> *)((long)&i_3 + 3),
               sample._M_t._M_impl.super__Rb_tree_header._M_node_count);
    vStack_220 = 0;
    std::array<unsigned_long,_33UL>::fill
              ((array<unsigned_long,_33UL> *)local_218,&stack0xfffffffffffffde0);
    i._7_1_ = *(byte *)bucketsize._M_elems[0x20];
    bVar9 = true;
    uStack_230 = 1;
    pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                        ((array<unsigned_long,_33UL> *)local_218,(ulong)i._7_1_);
    *pvVar19 = *pvVar19 + 1;
    for (; uStack_230 < n; uStack_230 = uStack_230 + 1) {
      bVar2 = *(byte *)(bucketsize._M_elems[0x20] + uStack_230);
      if (bVar2 < i._7_1_) {
        bVar9 = false;
        break;
      }
      pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                          ((array<unsigned_long,_33UL> *)local_218,(ulong)bVar2);
      *pvVar19 = *pvVar19 + 1;
      i._7_1_ = bVar2;
    }
    for (; uStack_230 < n; uStack_230 = uStack_230 + 1) {
      pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                          ((array<unsigned_long,_33UL> *)local_218,
                           (ulong)*(byte *)(bucketsize._M_elems[0x20] + uStack_230));
      *pvVar19 = *pvVar19 + 1;
    }
    if (!bVar9) {
      __src = malloc(n << 3);
      pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                          (&multikey_multipivot<unsigned_char,_16U>::bucketindex,0);
      *pvVar19 = 0;
      for (i_5._4_4_ = 1; i_5._4_4_ < 0x21; i_5._4_4_ = i_5._4_4_ + 1) {
        pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                            (&multikey_multipivot<unsigned_char,_16U>::bucketindex,
                             (ulong)(i_5._4_4_ - 1));
        vVar3 = *pvVar19;
        pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                            ((array<unsigned_long,_33UL> *)local_218,(ulong)(i_5._4_4_ - 1));
        vVar4 = *pvVar19;
        pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                            (&multikey_multipivot<unsigned_char,_16U>::bucketindex,(ulong)i_5._4_4_)
        ;
        *pvVar19 = vVar3 + vVar4;
      }
      for (b = 0; b < n; b = b + 1) {
        puVar5 = strings[b];
        pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                            (&multikey_multipivot<unsigned_char,_16U>::bucketindex,
                             (ulong)*(byte *)(bucketsize._M_elems[0x20] + b));
        vVar3 = *pvVar19;
        *pvVar19 = vVar3 + 1;
        *(uchar **)((long)__src + vVar3 * 8) = puVar5;
      }
      memcpy(strings,__src,n << 3);
      free(__src);
    }
    local_10 = bucketsize._M_elems[0x20];
    free((void *)bucketsize._M_elems[0x20]);
    pvVar19 = std::array<unsigned_long,_33UL>::operator[]((array<unsigned_long,_33UL> *)local_218,0)
    ;
    sStack_260 = *pvVar19;
    if (sStack_260 != 0) {
      multikey_multipivot<unsigned_char,16u>
                (strings,sStack_260,sample._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    for (local_264 = 0; local_264 < 0xf; local_264 = local_264 + 1) {
      pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                          ((array<unsigned_long,_33UL> *)local_218,(ulong)(local_264 * 2 + 1));
      sVar6 = *pvVar19;
      if (sVar6 != 0) {
        pvVar18 = std::array<unsigned_char,_16UL>::operator[]
                            ((array<unsigned_char,_16UL> *)((long)&i_3 + 3),(ulong)local_264);
        bVar9 = is_end<unsigned_char>(*pvVar18);
        if (!bVar9) {
          multikey_multipivot<unsigned_char,16u>
                    (strings + sStack_260,sVar6,
                     sample._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
        }
      }
      pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                          ((array<unsigned_long,_33UL> *)local_218,(ulong)(local_264 * 2 + 2));
      sVar7 = sample._M_t._M_impl.super__Rb_tree_header._M_node_count;
      n_00 = *pvVar19;
      if (n_00 != 0) {
        pvVar18 = std::array<unsigned_char,_16UL>::operator[]
                            ((array<unsigned_char,_16UL> *)((long)&i_3 + 3),(ulong)local_264);
        uVar8 = *pvVar18;
        pvVar18 = std::array<unsigned_char,_16UL>::operator[]
                            ((array<unsigned_char,_16UL> *)((long)&i_3 + 3),(ulong)(local_264 + 1));
        uVar11 = lcp(uVar8,*pvVar18);
        multikey_multipivot<unsigned_char,16u>(strings + sVar6 + sStack_260,n_00,sVar7 + uVar11);
      }
      sStack_260 = n_00 + sVar6 + sStack_260;
    }
    pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                        ((array<unsigned_long,_33UL> *)local_218,0x1f);
    sVar6 = *pvVar19;
    if (sVar6 != 0) {
      pvVar18 = std::array<unsigned_char,_16UL>::operator[]
                          ((array<unsigned_char,_16UL> *)((long)&i_3 + 3),0xf);
      bVar9 = is_end<unsigned_char>(*pvVar18);
      if (!bVar9) {
        multikey_multipivot<unsigned_char,16u>
                  (strings + sStack_260,sVar6,
                   sample._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
      }
      sStack_260 = sVar6 + sStack_260;
    }
    pvVar19 = std::array<unsigned_long,_33UL>::operator[]
                        ((array<unsigned_long,_33UL> *)local_218,0x20);
    if (*pvVar19 != 0) {
      multikey_multipivot<unsigned_char,16u>
                (strings + sStack_260,*pvVar19,
                 sample._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~set
              ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
               local_78);
  }
  return;
}

Assistant:

static void
multikey_multipivot(unsigned char** strings, size_t n, size_t depth)
{
	static_assert(Pivots > 0, "Pivots must be non-zero");
	static_assert(total_buckets(Pivots) < 0x100, "total number of bucket must be max 255");
	if (n < 15000) {
		mkqsort(strings, n, depth);
		return;
	}
	// TODO: collect frequencies to gain knowledge about distribution
	std::set<CharT> sample;
	for (unsigned i=0; i < Pivots; ++i) {
		double r=drand48();
		size_t pos = ((size_t)((n-7)*r));
		assert(pos+6 < n);
		std::array<CharT, 7> tmp;
		for (unsigned j=0;j<tmp.size();++j) {
			tmp[j] = get_char<CharT>(strings[pos+j], depth);
		}
		sample.insert(tmp.begin(), tmp.end());
	}
	// We _must_ select enough pivots -> insert junk.
	for (CharT i=1; sample.size() < Pivots; ++i) {
		if (is_end(i)) ++i;
		sample.insert(i);
	}
	// Pick pivots from the sample.
	std::vector<CharT> sample_array(sample.begin(), sample.end());
	sample.clear();
	std::array<CharT, Pivots> pivots;
	unsigned step = sample_array.size() / Pivots;
	assert(step > 0);
	for (unsigned i=0; i < Pivots; ++i) {
		pivots[i] = sample_array[step*i];
	}
	uint8_t* restrict oracle = static_cast<uint8_t*>(_mm_malloc(n, 16));
	fill_oracle<Pivots>(strings, n, oracle, pivots, depth);
	std::array<size_t, total_buckets(Pivots)> bucketsize;
	bucketsize.fill(0);
	uint8_t prev = oracle[0];
	bool sorted = true;
	size_t i=1;
	++bucketsize[prev];
	for (; i < n; ++i) {
		uint8_t bucket = oracle[i];
		if (prev > bucket) {
			sorted = false; break;
		}
		++bucketsize[bucket];
		prev = bucket;
	}
	for (; i < n; ++i)
		++bucketsize[oracle[i]];
	if (not sorted) {
		unsigned char** sorted = (unsigned char**)
			malloc(n*sizeof(unsigned char*));
		static std::array<size_t, total_buckets(Pivots)> bucketindex;
		bucketindex[0] = 0;
		for (unsigned i=1; i < total_buckets(Pivots); ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < n; ++i)
			sorted[bucketindex[oracle[i]]++] = strings[i];
		memcpy(strings, sorted, n*sizeof(unsigned char*));
		free(sorted);
	}
	_mm_free(oracle);
	size_t b=0;
	size_t bsum = bucketsize[0];
	if (bsum) multikey_multipivot<CharT, Pivots>(strings, bsum, depth);
	for (unsigned i=0; i < Pivots-1; ++i) {
		b = bucketsize[middle_bucket(i)];
		if (b and not is_end(pivots[i])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
					depth+sizeof(CharT));
		}
		bsum += b;
		if ((b = bucketsize[right_bucket(i)])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
				depth+lcp(pivots[i], pivots[i+1]));
		}
		bsum += b;
	}
	if ((b = bucketsize[middle_bucket(Pivots-1)])) {
		if (not is_end(pivots[Pivots-1]))
			multikey_multipivot<CharT, Pivots>(strings+bsum,
				b, depth+sizeof(CharT));
		bsum += b;
	}
	if ((b = bucketsize[right_bucket(Pivots-1)])) {
		multikey_multipivot<CharT, Pivots>(strings+bsum, b, depth);
	}
}